

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float GetDraggedColumnOffset(ImGuiColumns *columns,int column_index)

{
  float fVar1;
  float fVar2;
  ImGuiContext *pIVar3;
  float fVar4;
  float fVar5;
  float local_2c;
  float x;
  ImGuiWindow *window;
  ImGuiContext *g;
  int column_index_local;
  ImGuiColumns *columns_local;
  
  pIVar3 = GImGui;
  if (column_index < 1) {
    __assert_fail("column_index > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/imgui/imgui_widgets.cpp"
                  ,0x1bef,"float GetDraggedColumnOffset(ImGuiColumns *, int)");
  }
  if (GImGui->ActiveId == columns->ID + column_index) {
    fVar5 = (GImGui->IO).MousePos.x;
    fVar1 = (GImGui->ActiveIdClickOffset).x;
    fVar2 = (GImGui->CurrentWindow->Pos).x;
    fVar4 = ImGui::GetColumnOffset(column_index + -1);
    local_2c = ImMax<float>(((fVar5 - fVar1) + 4.0) - fVar2,
                            fVar4 + (pIVar3->Style).ColumnsMinSpacing);
    if ((columns->Flags & 4U) != 0) {
      fVar5 = ImGui::GetColumnOffset(column_index + 1);
      local_2c = ImMin<float>(local_2c,fVar5 - (pIVar3->Style).ColumnsMinSpacing);
    }
    return local_2c;
  }
  __assert_fail("g.ActiveId == columns->ID + ImGuiID(column_index)",
                "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/imgui/imgui_widgets.cpp"
                ,0x1bf0,"float GetDraggedColumnOffset(ImGuiColumns *, int)");
}

Assistant:

static float GetDraggedColumnOffset(ImGuiColumns* columns, int column_index)
{
    // Active (dragged) column always follow mouse. The reason we need this is that dragging a column to the right edge of an auto-resizing
    // window creates a feedback loop because we store normalized positions. So while dragging we enforce absolute positioning.
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(column_index > 0); // We are not supposed to drag column 0.
    IM_ASSERT(g.ActiveId == columns->ID + ImGuiID(column_index));

    float x = g.IO.MousePos.x - g.ActiveIdClickOffset.x + COLUMNS_HIT_RECT_HALF_WIDTH - window->Pos.x;
    x = ImMax(x, ImGui::GetColumnOffset(column_index - 1) + g.Style.ColumnsMinSpacing);
    if ((columns->Flags & ImGuiColumnsFlags_NoPreserveWidths))
        x = ImMin(x, ImGui::GetColumnOffset(column_index + 1) - g.Style.ColumnsMinSpacing);

    return x;
}